

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall
testing::internal::ExpectationBase::DescribeCallCountTo(ExpectationBase *this,ostream *os)

{
  bool bVar1;
  int actual_call_count;
  Cardinality *this_00;
  ostream *poVar2;
  char *pcVar3;
  char *local_38;
  char *local_30;
  ostream *os_local;
  ExpectationBase *this_local;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  std::operator<<(os,"         Expected: to be ");
  this_00 = cardinality(this);
  Cardinality::DescribeTo(this_00,os);
  std::operator<<(os,"\n           Actual: ");
  actual_call_count = call_count(this);
  Cardinality::DescribeActualCallCountTo(actual_call_count,os);
  poVar2 = std::operator<<(os," - ");
  bVar1 = IsOverSaturated(this);
  if (bVar1) {
    local_30 = "over-saturated";
  }
  else {
    bVar1 = IsSaturated(this);
    if (bVar1) {
      local_38 = "saturated";
    }
    else {
      bVar1 = IsSatisfied(this);
      local_38 = "unsatisfied";
      if (bVar1) {
        local_38 = "satisfied";
      }
    }
    local_30 = local_38;
  }
  poVar2 = std::operator<<(poVar2,local_30);
  poVar2 = std::operator<<(poVar2," and ");
  bVar1 = is_retired(this);
  pcVar3 = "active";
  if (bVar1) {
    pcVar3 = "retired";
  }
  std::operator<<(poVar2,pcVar3);
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();

  // Describes how many times the function is expected to be called.
  *os << "         Expected: to be ";
  cardinality().DescribeTo(os);
  *os << "\n           Actual: ";
  Cardinality::DescribeActualCallCountTo(call_count(), os);

  // Describes the state of the expectation (e.g. is it satisfied?
  // is it active?).
  *os << " - " << (IsOverSaturated() ? "over-saturated" :
                   IsSaturated() ? "saturated" :
                   IsSatisfied() ? "satisfied" : "unsatisfied")
      << " and "
      << (is_retired() ? "retired" : "active");
}